

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_deleteCols(HModel *this,int firstcol,int lastcol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer piVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  printf("Called model.util_deleteCols(firstcol=%d, lastcol=%d)\n");
  std::ostream::flush();
  lVar11 = (long)(lastcol - firstcol) + 1;
  iVar1 = this->numCol;
  iVar10 = (int)lVar11;
  uVar13 = iVar1 - iVar10;
  lVar16 = (long)iVar10;
  if (firstcol < (int)uVar13) {
    pdVar4 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)firstcol;
    lVar15 = lVar12 + lVar16;
    lVar17 = 0;
    do {
      pdVar4[lVar12 + lVar17] = pdVar4[lVar15 + lVar17];
      pdVar5[lVar12 + lVar17] = pdVar5[lVar15 + lVar17];
      pdVar6[lVar12 + lVar17] = pdVar6[lVar15 + lVar17];
      pdVar7[lVar12 + lVar17] = pdVar7[lVar15 + lVar17];
      lVar17 = lVar17 + 1;
    } while ((iVar1 - lVar12) - lVar16 != lVar17);
  }
  piVar8 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar8[firstcol];
  lVar12 = (long)iVar2;
  iVar3 = piVar8[(long)lastcol + 1];
  lVar15 = (long)iVar3;
  if (iVar3 < piVar8[iVar1]) {
    piVar9 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar9[lVar12] = piVar9[lVar15];
      pdVar4[lVar12] = pdVar4[lVar15];
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 1;
    } while (lVar15 < piVar8[this->numCol]);
    uVar13 = this->numCol - iVar10;
  }
  uVar14 = (ulong)uVar13;
  if (firstcol <= (int)uVar13) {
    lVar15 = (long)firstcol + -1;
    do {
      piVar8[lVar15 + 1] = piVar8[lVar16 + lVar15 + 1] - (iVar3 - iVar2);
      uVar14 = this->numCol - lVar11;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (long)uVar14);
  }
  this->numCol = (int)uVar14;
  this->numTot = this->numTot - iVar10;
  this->mlFg_haveMatrixColWise = 0;
  this->mlFg_haveMatrixRowWise = 0;
  return;
}

Assistant:

void HModel::util_deleteCols(int firstcol, int lastcol) {
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  assert(firstcol <= lastcol);
#ifdef JAJH_dev
  printf("Called model.util_deleteCols(firstcol=%d, lastcol=%d)\n", firstcol, lastcol);cout << flush;
#endif
  int colStep = lastcol-firstcol+1;
  for (int col = firstcol; col < numCol-colStep; col++) {
    //    printf("Copy from colCost[%d] to colCost[%d]\n", col+colStep, col);cout << flush;
    colCost[col] = colCost[col+colStep];
    colLower[col] = colLower[col+colStep];
    colUpper[col] = colUpper[col+colStep];
    colScale[col] = colScale[col+colStep];
  }
  int elOs = Astart[firstcol];
  int elStep = Astart[lastcol+1]-elOs;
  //    printf("El loop over cols %2d [%2d] to %2d [%2d]\n", lastcol+1, Astart[lastcol+1], numCol+1, Astart[numCol]-1);
  for (int el = Astart[lastcol+1]; el < Astart[numCol]; el++) {
    //        printf("Over-write entry %3d [%3d] by entry %3d [%3d]\n", el-elStep, Aindex[el-elStep], el, Aindex[el]);
    Aindex[el-elStep] = Aindex[el];
    Avalue[el-elStep] = Avalue[el];
  }
    
  for (int col = firstcol; col <= numCol-colStep; col++) {
    //    printf("Over-write start %3d [%3d] by entry %3d [%3d]\n", col, Astart[col], col+colStep,  Astart[col+colStep]-elStep);
    Astart[col] = Astart[col+colStep]-elStep;}
  
  //Reduce the number of columns and total number of variables in the model
  numCol -= colStep;
  numTot -= colStep;

  //ToDo Determine consequences for basis when deleting columns
  //Invalidate matrix copies
  mlFg_haveMatrixColWise = 0;
  mlFg_haveMatrixRowWise = 0;
}